

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutputTest.cpp
# Opt level: O2

void __thiscall TEST_GROUP_CppUTestGroupTestOutput::setup(TEST_GROUP_CppUTestGroupTestOutput *this)

{
  StringBufferTestOutput *this_00;
  UtestShell *pUVar1;
  TestFailure *pTVar2;
  TestResult *this_01;
  SimpleString SStack_28;
  
  this_00 = (StringBufferTestOutput *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestOutputTest.cpp"
                         ,0x38);
  StringBufferTestOutput::StringBufferTestOutput(this_00);
  this->mock = this_00;
  this->printer = (TestOutput *)this_00;
  pUVar1 = (UtestShell *)
           operator_new(0x38,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestOutputTest.cpp"
                        ,0x3a);
  UtestShell::UtestShell(pUVar1,"group","test","file",10);
  this->tst = pUVar1;
  pTVar2 = (TestFailure *)
           operator_new(0x68,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestOutputTest.cpp"
                        ,0x3b);
  pUVar1 = this->tst;
  SimpleString::SimpleString(&SStack_28,"message");
  TestFailure::TestFailure(pTVar2,pUVar1,"failfile",0x14,&SStack_28);
  this->f = pTVar2;
  SimpleString::~SimpleString(&SStack_28);
  pTVar2 = (TestFailure *)
           operator_new(0x68,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestOutputTest.cpp"
                        ,0x3c);
  pUVar1 = this->tst;
  SimpleString::SimpleString(&SStack_28,"message");
  TestFailure::TestFailure(pTVar2,pUVar1,"file",0x14,&SStack_28);
  this->f2 = pTVar2;
  SimpleString::~SimpleString(&SStack_28);
  pTVar2 = (TestFailure *)
           operator_new(0x68,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestOutputTest.cpp"
                        ,0x3d);
  pUVar1 = this->tst;
  SimpleString::SimpleString(&SStack_28,"message");
  TestFailure::TestFailure(pTVar2,pUVar1,"file",2,&SStack_28);
  this->f3 = pTVar2;
  SimpleString::~SimpleString(&SStack_28);
  this_01 = (TestResult *)
            operator_new(0x70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestOutputTest.cpp"
                         ,0x3e);
  TestResult::TestResult(this_01,&this->mock->super_TestOutput);
  this->result = this_01;
  TestResult::setTotalExecutionTime(this_01,10);
  millisTime = 0;
  CppUTestStore(&GetPlatformSpecificTimeInMillis);
  GetPlatformSpecificTimeInMillis = MockGetPlatformSpecificTimeInMillis;
  TestOutput::setWorkingEnvironment(eclipse);
  return;
}

Assistant:

void setup() _override
    {
        mock = new StringBufferTestOutput();
        printer = mock;
        tst = new UtestShell("group", "test", "file", 10);
        f = new TestFailure(tst, "failfile", 20, "message");
        f2 = new TestFailure(tst, "file", 20, "message");
        f3 = new TestFailure(tst, "file", 2, "message");
        result = new TestResult(*mock);
        result->setTotalExecutionTime(10);
        millisTime = 0;
        UT_PTR_SET(GetPlatformSpecificTimeInMillis, MockGetPlatformSpecificTimeInMillis);
        TestOutput::setWorkingEnvironment(TestOutput::eclipse);

    }